

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

vertex_t __thiscall
Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::
get_max_vertex(Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_> *this,
              simplex_t idx,dimension_t k,vertex_t param_3)

{
  logic_error *this_00;
  vertex_t param_3_local;
  dimension_t k_local;
  simplex_t idx_local;
  Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_> *this_local;
  
  if ('\0' < k) {
    return (vertex_t)(idx >> ((char)this->bits_per_vertex * (k + -1) & 0x3fU));
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

vertex_t get_max_vertex(const simplex_t idx, dimension_t k, const vertex_t) const {
      GUDHI_assert(k > 0);
      --k;
#ifdef USE_N_MINUS_K
      return static_cast<vertex_t>(idx >> (bits_per_vertex * k)) + k;
#else
      return static_cast<vertex_t>(idx >> (bits_per_vertex * k));
#endif
    }